

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

void glob_cleanup(URLGlob **globp)

{
  URLGlob *__ptr;
  long lVar1;
  ulong uVar2;
  
  __ptr = *globp;
  if (__ptr != (URLGlob *)0x0) {
    for (uVar2 = 0; uVar2 < __ptr->size; uVar2 = uVar2 + 1) {
      if ((__ptr->pattern[uVar2].type == UPTSet) &&
         (__ptr->pattern[uVar2].content.Set.elements != (char **)0x0)) {
        for (lVar1 = __ptr->pattern[uVar2].content.Set.size; 0 < lVar1; lVar1 = lVar1 + -1) {
          free(*(void **)(__ptr->pattern[uVar2].content.NumRange.min_n + -8 + lVar1 * 8));
          *(undefined8 *)(__ptr->pattern[uVar2].content.NumRange.min_n + -8 + lVar1 * 8) = 0;
        }
        free(__ptr->pattern[uVar2].content.Set.elements);
        __ptr->pattern[uVar2].content.Set.elements = (char **)0x0;
      }
    }
    free(__ptr->glob_buffer);
    free(__ptr);
    *globp = (URLGlob *)0x0;
  }
  return;
}

Assistant:

void glob_cleanup(struct URLGlob **globp)
{
  size_t i;
  curl_off_t elem;
  struct URLGlob *glob = *globp;

  if(!glob)
    return;

  for(i = 0; i < glob->size; i++) {
    if((glob->pattern[i].type == UPTSet) &&
       (glob->pattern[i].content.Set.elements)) {
      for(elem = glob->pattern[i].content.Set.size - 1;
          elem >= 0;
          --elem) {
        curlx_safefree(glob->pattern[i].content.Set.elements[elem]);
      }
      curlx_safefree(glob->pattern[i].content.Set.elements);
    }
  }
  curlx_safefree(glob->glob_buffer);
  curlx_safefree(glob);
  *globp = NULL;
}